

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::TableBox::print(TableBox *this,Canvas *canvas,int row,int col)

{
  bool bVar1;
  reference this_00;
  reference __in;
  type *ppBVar2;
  type *ptVar3;
  type *pos;
  type *box;
  __normal_iterator<const_std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_*,_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
  local_58;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  *__range2;
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  *current_row;
  const_iterator __end1;
  const_iterator __begin1;
  Matrix<std::pair<Box_*,_Position>_> *__range1;
  int col_local;
  int row_local;
  Canvas *canvas_local;
  TableBox *this_local;
  
  __end1 = std::
           vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
           ::begin(&this->table_);
  current_row = (vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 *)std::
                   vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                   ::end(&this->table_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_*,_std::vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>_>
                                *)&current_row);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_*,_std::vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::
             vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
             ::begin(this_00);
    local_58._M_current =
         (pair<tli_window_manager::Box_*,_std::pair<int,_int>_> *)
         std::
         vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
         ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&local_58);
      if (!bVar1) break;
      __in = __gnu_cxx::
             __normal_iterator<const_std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_*,_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
             ::operator*(&__end2);
      ppBVar2 = std::get<0ul,tli_window_manager::Box*,std::pair<int,int>>(__in);
      ptVar3 = std::get<1ul,tli_window_manager::Box*,std::pair<int,int>>(__in);
      if (*ppBVar2 != (type)0x0) {
        (*(*ppBVar2)->_vptr_Box[1])
                  (*ppBVar2,canvas,(ulong)(uint)(ptVar3->first + row),
                   (ulong)(uint)(ptVar3->second + col));
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_*,_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_*,_std::vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TableBox::print(Canvas &canvas, int row, int col) const {
    for (const auto &current_row : table_) {
        for (const auto &[box, pos] : current_row) {
            if (box) {
                box->print(canvas, pos.first + row, pos.second + col);
            }
        }
    }
}